

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O1

void __thiscall
Fl_PostScript_Graphics_Driver::draw_image_mono
          (Fl_PostScript_Graphics_Driver *this,Fl_Draw_Image_Cb call,void *data,int ix,int iy,int iw
          ,int ih,int D)

{
  int iVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  uchar *puVar6;
  undefined8 *data_00;
  void *pvVar7;
  long lVar8;
  char *pcVar9;
  uchar *puVar10;
  int iVar11;
  uchar *puVar12;
  undefined4 uVar13;
  double dVar14;
  
  dVar2 = (double)iw;
  dVar3 = (double)ih;
  fwrite("save\n",5,1,(FILE *)this->output);
  uVar13 = SUB84((double)ix,0);
  if (this->lang_level_ < 2) {
    fprintf((FILE *)this->output,"%g %g %g %g %i %i GI",uVar13,(double)iy + dVar3,dVar2,-dVar3,
            (ulong)(uint)iw,(ulong)(uint)ih);
  }
  else {
    pcVar9 = "true";
    if (this->interpolate_ == 0) {
      pcVar9 = "false";
    }
    dVar14 = (double)iy + dVar3;
    if ((this->lang_level_ == 2) || (this->mask == (uchar *)0x0)) {
      fprintf((FILE *)this->output,"%g %g %g %g %i %i %s GII\n",uVar13,dVar14,dVar2,-dVar3,
              (ulong)(uint)iw,(ulong)(uint)ih);
    }
    else {
      fprintf((FILE *)this->output,"%g %g %g %g %i %i %i %i %s GIM\n",uVar13,dVar14,dVar2,-dVar3,
              (ulong)(uint)iw,(ulong)(uint)ih,(ulong)(uint)this->mx,(ulong)(uint)this->my,pcVar9);
    }
  }
  puVar6 = (uchar *)operator_new__((long)(D * iw));
  puVar10 = this->mask;
  data_00 = (undefined8 *)operator_new(0x90);
  data_00[0x11] = 0;
  pvVar7 = operator_new(0x14);
  iVar5 = 0;
  *(undefined8 *)((long)pvVar7 + 4) = 0;
  *data_00 = pvVar7;
  if (0 < ih) {
    do {
      if (((this->mask != (uchar *)0x0) && (2 < this->lang_level_)) && (0 < this->my / ih)) {
        iVar11 = 0;
        do {
          if (0 < this->mx) {
            lVar8 = 0;
            do {
              write_rle85(this,""[puVar10[lVar8] & 0xf] << 4 | ""[puVar10[lVar8] >> 4],data_00);
              iVar1 = this->mx + 7;
              iVar4 = this->mx + 0xe;
              if (-1 < iVar1) {
                iVar4 = iVar1;
              }
              lVar8 = lVar8 + 1;
            } while ((int)lVar8 < iVar4 >> 3);
            puVar10 = puVar10 + lVar8;
          }
          iVar11 = iVar11 + 1;
        } while (iVar11 < this->my / ih);
      }
      (*call)(data,0,iVar5,iw,puVar6);
      puVar12 = puVar6;
      iVar11 = iw;
      if (0 < iw) {
        do {
          write_rle85(this,*puVar12,data_00);
          iVar11 = iVar11 + -1;
          puVar12 = puVar12 + D;
        } while (iVar11 != 0);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != ih);
  }
  close_rle85(this,data_00);
  fwrite("restore\n",8,1,(FILE *)this->output);
  operator_delete__(puVar6);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::draw_image_mono(Fl_Draw_Image_Cb call, void *data, int ix, int iy, int iw, int ih, int D) {
  double x = ix, y = iy, w = iw, h = ih;

  fprintf(output,"save\n");
  int i,j,k;
  const char * interpol;
  if (lang_level_>1){
    if (interpolate_) interpol="true";
    else interpol="false";
    if (mask && lang_level_>2)
      fprintf(output, "%g %g %g %g %i %i %i %i %s GIM\n", x , y+h , w , -h , iw , ih, mx, my, interpol);
    else
      fprintf(output, "%g %g %g %g %i %i %s GII\n", x , y+h , w , -h , iw , ih, interpol);
  } else
    fprintf(output , "%g %g %g %g %i %i GI", x , y+h , w , -h , iw , ih);

  int LD=iw*D;
  uchar *rgbdata=new uchar[LD];
  uchar *curmask=mask;
  void *big = prepare_rle85();
  for (j=0; j<ih;j++){

    if (mask && lang_level_>2){  // InterleaveType 2 mask data
      for (k=0; k<my/ih;k++){ //for alpha pseudo-masking
        for (i=0; i<((mx+7)/8);i++){
          write_rle85(swap_byte(*curmask), big);
          curmask++;
        }
      }
    }
    call(data,0,j,iw,rgbdata);
    uchar *curdata=rgbdata;
    for (i=0 ; i<iw ; i++) {
      write_rle85(curdata[0], big);
      curdata +=D;
    }
  }
  close_rle85(big);
  fprintf(output,"restore\n");
  delete[] rgbdata;
}